

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChakraRtInterface.cpp
# Opt level: O0

bool ChakraRTInterface::LoadChakraDll(ArgInfo *argInfo,HINSTANCE *outLibrary)

{
  DWORD DVar1;
  HINSTANCE module;
  PAL_FILE *stream;
  char local_138 [4];
  int ret;
  char dllName [260];
  HINSTANCE library;
  HINSTANCE *outLibrary_local;
  ArgInfo *argInfo_local;
  
  m_argInfo = argInfo;
  GetBinaryPathWithFileNameA(local_138,0x104,chakraDllName);
  module = LoadChakraCore(local_138);
  *outLibrary = module;
  if (module == (HINSTANCE)0x0) {
    DVar1 = GetLastError();
    stream = PAL_get_stderr(0);
    PAL_fwprintf(stream,L"FATAL ERROR: Unable to load %S GetLastError=0x%x\n",local_138,(ulong)DVar1
                );
    argInfo_local._7_1_ = false;
  }
  else if ((m_usageStringPrinted & 1U) == 0) {
    m_jsApiHooks.pfJsrtCreateRuntime =
         (JsrtCreateRuntimePtr)GetChakraCoreSymbol(module,"JsCreateRuntime");
    m_jsApiHooks.pfJsrtCreateContext =
         (JsrtCreateContextPtr)GetChakraCoreSymbol(module,"JsCreateContext");
    m_jsApiHooks.pfJsrtSetObjectBeforeCollectCallback =
         (JsrtSetObjectBeforeCollectCallbackPtr)
         GetChakraCoreSymbol(module,"JsSetObjectBeforeCollectCallback");
    m_jsApiHooks.pfJsrtSetRuntimeDomWrapperTracingCallbacks =
         (JsrtSetRuntimeDomWrapperTracingCallbacksPtr)
         GetChakraCoreSymbol(module,"JsSetRuntimeDomWrapperTracingCallbacks");
    m_jsApiHooks.pfJsrtSetRuntimeMemoryLimit =
         (JsrtSetRuntimeMemoryLimitPtr)GetChakraCoreSymbol(module,"JsSetRuntimeMemoryLimit");
    m_jsApiHooks.pfJsrtSetCurrentContext =
         (JsrtSetCurrentContextPtr)GetChakraCoreSymbol(module,"JsSetCurrentContext");
    m_jsApiHooks.pfJsrtGetCurrentContext =
         (JsrtGetCurrentContextPtr)GetChakraCoreSymbol(module,"JsGetCurrentContext");
    m_jsApiHooks.pfJsrtDisposeRuntime =
         (JsrtDisposeRuntimePtr)GetChakraCoreSymbol(module,"JsDisposeRuntime");
    m_jsApiHooks.pfJsrtCreateObject =
         (JsrtCreateObjectPtr)GetChakraCoreSymbol(module,"JsCreateObject");
    m_jsApiHooks.pfJsrtCreateExternalObject =
         (JsrtCreateExternalObjectPtr)GetChakraCoreSymbol(module,"JsCreateExternalObject");
    m_jsApiHooks.pfJsrtGetArrayForEachFunction =
         (JsrtGetArrayForEachFunctionPtr)GetChakraCoreSymbol(module,"JsGetArrayForEachFunction");
    m_jsApiHooks.pfJsrtGetArrayKeysFunction =
         (JsrtGetArrayKeysFunctionPtr)GetChakraCoreSymbol(module,"JsGetArrayKeysFunction");
    m_jsApiHooks.pfJsrtGetArrayValuesFunction =
         (JsrtGetArrayValuesFunctionPtr)GetChakraCoreSymbol(module,"JsGetArrayValuesFunction");
    m_jsApiHooks.pfJsrtGetArrayEntriesFunction =
         (JsrtGetArrayEntriesFunctionPtr)GetChakraCoreSymbol(module,"JsGetArrayEntriesFunction");
    m_jsApiHooks.pfJsrtGetPropertyIdSymbolIterator =
         (JsrtGetPropertyIdSymbolIteratorPtr)
         GetChakraCoreSymbol(module,"JsGetPropertyIdSymbolIterator");
    m_jsApiHooks.pfJsrtGetErrorPrototype =
         (JsrtGetErrorPrototypePtr)GetChakraCoreSymbol(module,"JsGetErrorPrototype");
    m_jsApiHooks.pfJsrtGetIteratorPrototype =
         (JsrtGetIteratorPrototypePtr)GetChakraCoreSymbol(module,"JsGetIteratorPrototype");
    m_jsApiHooks.pfJsrtCreateFunction =
         (JsrtCreateFunctionPtr)GetChakraCoreSymbol(module,"JsCreateFunction");
    m_jsApiHooks.pfJsrtCreateNamedFunction =
         (JsCreateNamedFunctionPtr)GetChakraCoreSymbol(module,"JsCreateNamedFunction");
    m_jsApiHooks.pfJsrtSetProperty = (JsrtSetPropertyPtr)GetChakraCoreSymbol(module,"JsSetProperty")
    ;
    m_jsApiHooks.pfJsrtGetGlobalObject =
         (JsrtGetGlobalObjectPtr)GetChakraCoreSymbol(module,"JsGetGlobalObject");
    m_jsApiHooks.pfJsrtGetUndefinedValue =
         (JsrtGetUndefinedValuePtr)GetChakraCoreSymbol(module,"JsGetUndefinedValue");
    m_jsApiHooks.pfJsrtGetNullValue =
         (JsrtGetUndefinedValuePtr)GetChakraCoreSymbol(module,"JsGetNullValue");
    m_jsApiHooks.pfJsrtGetTrueValue =
         (JsrtGetUndefinedValuePtr)GetChakraCoreSymbol(module,"JsGetTrueValue");
    m_jsApiHooks.pfJsrtGetFalseValue =
         (JsrtGetUndefinedValuePtr)GetChakraCoreSymbol(module,"JsGetFalseValue");
    m_jsApiHooks.pfJsrtConvertValueToString =
         (JsrtConvertValueToStringPtr)GetChakraCoreSymbol(module,"JsConvertValueToString");
    m_jsApiHooks.pfJsrtConvertValueToNumber =
         (JsrtConvertValueToNumberPtr)GetChakraCoreSymbol(module,"JsConvertValueToNumber");
    m_jsApiHooks.pfJsrtConvertValueToBoolean =
         (JsrtConvertValueToBooleanPtr)GetChakraCoreSymbol(module,"JsConvertValueToBoolean");
    m_jsApiHooks.pfJsrtBooleanToBool =
         (JsrtBooleanToBoolPtr)GetChakraCoreSymbol(module,"JsBooleanToBool");
    m_jsApiHooks.pfJsrtGetProperty = (JsrtGetPropertyPtr)GetChakraCoreSymbol(module,"JsGetProperty")
    ;
    m_jsApiHooks.pfJsrtHasProperty = (JsrtHasPropertyPtr)GetChakraCoreSymbol(module,"JsHasProperty")
    ;
    m_jsApiHooks.pfJsrtCallFunction =
         (JsrtCallFunctionPtr)GetChakraCoreSymbol(module,"JsCallFunction");
    m_jsApiHooks.pfJsrtNumberToDouble =
         (JsrtNumberToDoublePtr)GetChakraCoreSymbol(module,"JsNumberToDouble");
    m_jsApiHooks.pfJsrtNumberToInt = (JsrtNumberToIntPtr)GetChakraCoreSymbol(module,"JsNumberToInt")
    ;
    m_jsApiHooks.pfJsrtIntToNumber = (JsrtIntToNumberPtr)GetChakraCoreSymbol(module,"JsIntToNumber")
    ;
    m_jsApiHooks.pfJsrtDoubleToNumber =
         (JsrtDoubleToNumberPtr)GetChakraCoreSymbol(module,"JsDoubleToNumber");
    m_jsApiHooks.pfJsrtGetExternalData =
         (JsrtGetExternalDataPtr)GetChakraCoreSymbol(module,"JsGetExternalData");
    m_jsApiHooks.pfJsrtSetExternalData =
         (JsrtSetExternalDataPtr)GetChakraCoreSymbol(module,"JsSetExternalData");
    m_jsApiHooks.pfJsrtCloneObject = (JsrtCloneObjectPtr)GetChakraCoreSymbol(module,"JsCloneObject")
    ;
    m_jsApiHooks.pfJsrtCreateArray = (JsrtCreateArrayPtr)GetChakraCoreSymbol(module,"JsCreateArray")
    ;
    m_jsApiHooks.pfJsrtCreateArrayBuffer =
         (JsrtCreateArrayBufferPtr)GetChakraCoreSymbol(module,"JsCreateArrayBuffer");
    m_jsApiHooks.pfJsrtCreateSharedArrayBufferWithSharedContent =
         (JsrtCreateSharedArrayBufferWithSharedContentPtr)
         GetChakraCoreSymbol(module,"JsCreateSharedArrayBufferWithSharedContent");
    m_jsApiHooks.pfJsrtGetSharedArrayBufferContent =
         (JsrtGetSharedArrayBufferContentPtr)
         GetChakraCoreSymbol(module,"JsGetSharedArrayBufferContent");
    m_jsApiHooks.pfJsrtReleaseSharedArrayBufferContentHandle =
         (JsrtReleaseSharedArrayBufferContentHandlePtr)
         GetChakraCoreSymbol(module,"JsReleaseSharedArrayBufferContentHandle");
    m_jsApiHooks.pfJsrtGetArrayBufferStorage =
         (JsrtGetArrayBufferStoragePtr)GetChakraCoreSymbol(module,"JsGetArrayBufferStorage");
    m_jsApiHooks.pfJsrtHasException =
         (JsrtHasExceptionPtr)GetChakraCoreSymbol(module,"JsHasException");
    m_jsApiHooks.pfJsrtSetException =
         (JsrtSetExceptionPtr)GetChakraCoreSymbol(module,"JsSetException");
    m_jsApiHooks.pfJsrtGetAndClearExceptionWithMetadata =
         (JsrtGetAndClearExceptiopnWithMetadataPtr)
         GetChakraCoreSymbol(module,"JsGetAndClearExceptionWithMetadata");
    m_jsApiHooks.pfJsrtGetAndClearException =
         (JsrtGetAndClearExceptiopnPtr)GetChakraCoreSymbol(module,"JsGetAndClearException");
    m_jsApiHooks.pfJsrtCreateError = (JsrtCreateErrorPtr)GetChakraCoreSymbol(module,"JsCreateError")
    ;
    m_jsApiHooks.pfJsrtGetRuntime = (JsrtGetRuntimePtr)GetChakraCoreSymbol(module,"JsGetRuntime");
    m_jsApiHooks.pfJsrtRelease = (JsrtReleasePtr)GetChakraCoreSymbol(module,"JsRelease");
    m_jsApiHooks.pfJsrtAddRef = (JsrtAddRefPtr)GetChakraCoreSymbol(module,"JsAddRef");
    m_jsApiHooks.pfJsrtGetValueType = (JsrtGetValueType)GetChakraCoreSymbol(module,"JsGetValueType")
    ;
    m_jsApiHooks.pfJsrtGetIndexedProperty =
         (JsrtGetIndexedPropertyPtr)GetChakraCoreSymbol(module,"JsGetIndexedProperty");
    m_jsApiHooks.pfJsrtSetIndexedProperty =
         (JsrtSetIndexedPropertyPtr)GetChakraCoreSymbol(module,"JsSetIndexedProperty");
    m_jsApiHooks.pfJsrtSetPromiseContinuationCallback =
         (JsrtSetPromiseContinuationCallbackPtr)
         GetChakraCoreSymbol(module,"JsSetPromiseContinuationCallback");
    m_jsApiHooks.pfJsrtSetHostPromiseRejectionTracker =
         (JsrtSetHostPromiseRejectionTrackerPtr)
         GetChakraCoreSymbol(module,"JsSetHostPromiseRejectionTracker");
    m_jsApiHooks.pfJsrtGetContextOfObject =
         (JsrtGetContextOfObject)GetChakraCoreSymbol(module,"JsGetContextOfObject");
    m_jsApiHooks.pfJsrtInitializeModuleRecord =
         (JsInitializeModuleRecordPtr)GetChakraCoreSymbol(module,"JsInitializeModuleRecord");
    m_jsApiHooks.pfJsrtParseModuleSource =
         (JsParseModuleSourcePtr)GetChakraCoreSymbol(module,"JsParseModuleSource");
    m_jsApiHooks.pfJsrtSetModuleHostInfo =
         (JsSetModuleHostInfoPtr)GetChakraCoreSymbol(module,"JsSetModuleHostInfo");
    m_jsApiHooks.pfJsrtGetModuleHostInfo =
         (JsGetModuleHostInfoPtr)GetChakraCoreSymbol(module,"JsGetModuleHostInfo");
    m_jsApiHooks.pfJsrtModuleEvaluation =
         (JsModuleEvaluationPtr)GetChakraCoreSymbol(module,"JsModuleEvaluation");
    m_jsApiHooks.pfJsrtGetModuleNamespace =
         (JsGetModuleNamespacePtr)GetChakraCoreSymbol(module,"JsGetModuleNamespace");
    m_jsApiHooks.pfJsrtDiagStartDebugging =
         (JsrtDiagStartDebugging)GetChakraCoreSymbol(module,"JsDiagStartDebugging");
    m_jsApiHooks.pfJsrtDiagStopDebugging =
         (JsrtDiagStopDebugging)GetChakraCoreSymbol(module,"JsDiagStopDebugging");
    m_jsApiHooks.pfJsrtDiagGetSource =
         (JsrtDiagGetSource)GetChakraCoreSymbol(module,"JsDiagGetSource");
    m_jsApiHooks.pfJsrtDiagSetBreakpoint =
         (JsrtDiagSetBreakpoint)GetChakraCoreSymbol(module,"JsDiagSetBreakpoint");
    m_jsApiHooks.pfJsrtDiagGetStackTrace =
         (JsrtDiagGetStackTrace)GetChakraCoreSymbol(module,"JsDiagGetStackTrace");
    m_jsApiHooks.pfJsrtDiagRequestAsyncBreak =
         (JsrtDiagRequestAsyncBreak)GetChakraCoreSymbol(module,"JsDiagRequestAsyncBreak");
    m_jsApiHooks.pfJsrtDiagGetBreakpoints =
         (JsrtDiagGetBreakpoints)GetChakraCoreSymbol(module,"JsDiagGetBreakpoints");
    m_jsApiHooks.pfJsrtDiagRemoveBreakpoint =
         (JsrtDiagRemoveBreakpoint)GetChakraCoreSymbol(module,"JsDiagRemoveBreakpoint");
    m_jsApiHooks.pfJsrtDiagSetBreakOnException =
         (JsrtDiagSetBreakOnException)GetChakraCoreSymbol(module,"JsDiagSetBreakOnException");
    m_jsApiHooks.pfJsrtDiagGetBreakOnException =
         (JsrtDiagGetBreakOnException)GetChakraCoreSymbol(module,"JsDiagGetBreakOnException");
    m_jsApiHooks.pfJsrtDiagSetStepType =
         (JsrtDiagSetStepType)GetChakraCoreSymbol(module,"JsDiagSetStepType");
    m_jsApiHooks.pfJsrtDiagGetScripts =
         (JsrtDiagGetScripts)GetChakraCoreSymbol(module,"JsDiagGetScripts");
    m_jsApiHooks.pfJsrtDiagGetFunctionPosition =
         (JsrtDiagGetFunctionPosition)GetChakraCoreSymbol(module,"JsDiagGetFunctionPosition");
    m_jsApiHooks.pfJsrtDiagGetStackProperties =
         (JsrtDiagGetStackProperties)GetChakraCoreSymbol(module,"JsDiagGetStackProperties");
    m_jsApiHooks.pfJsrtDiagGetProperties =
         (JsrtDiagGetProperties)GetChakraCoreSymbol(module,"JsDiagGetProperties");
    m_jsApiHooks.pfJsrtDiagGetObjectFromHandle =
         (JsrtDiagGetObjectFromHandle)GetChakraCoreSymbol(module,"JsDiagGetObjectFromHandle");
    m_jsApiHooks.pfJsrtDiagEvaluate = (JsrtDiagEvaluate)GetChakraCoreSymbol(module,"JsDiagEvaluate")
    ;
    m_jsApiHooks.pfJsrtRun = (JsrtRun)GetChakraCoreSymbol(module,"JsRun");
    m_jsApiHooks.pfJsrtParse = (JsrtParse)GetChakraCoreSymbol(module,"JsParse");
    m_jsApiHooks.pfJsrtSerialize = (JsrtSerialize)GetChakraCoreSymbol(module,"JsSerialize");
    m_jsApiHooks.pfJsrtRunSerialized =
         (JsrtRunSerialized)GetChakraCoreSymbol(module,"JsRunSerialized");
    m_jsApiHooks.pfJsrtGetStringLength =
         (JsrtGetStringLength)GetChakraCoreSymbol(module,"JsGetStringLength");
    m_jsApiHooks.pfJsrtCreateString = (JsrtCreateString)GetChakraCoreSymbol(module,"JsCreateString")
    ;
    m_jsApiHooks.pfJsrtCreateStringUtf16 =
         (JsrtCreateStringUtf16)GetChakraCoreSymbol(module,"JsCreateStringUtf16");
    m_jsApiHooks.pfJsrtCopyString = (JsrtCopyString)GetChakraCoreSymbol(module,"JsCopyString");
    m_jsApiHooks.pfJsrtCreatePropertyId =
         (JsrtCreatePropertyId)GetChakraCoreSymbol(module,"JsCreatePropertyId");
    m_jsApiHooks.pfJsrtCreateExternalArrayBuffer =
         (JsrtCreateExternalArrayBuffer)GetChakraCoreSymbol(module,"JsCreateExternalArrayBuffer");
    m_jsApiHooks.pfJsrtGetProxyProperties =
         (JsrtGetProxyProperties)GetChakraCoreSymbol(module,"JsGetProxyProperties");
    m_jsApiHooks.pfJsrtSerializeParserState =
         (JsrtSerializeParserState)GetChakraCoreSymbol(module,"JsSerializeParserState");
    m_jsApiHooks.pfJsrtRunScriptWithParserState =
         (JsrtRunScriptWithParserState)GetChakraCoreSymbol(module,"JsRunScriptWithParserState");
    m_jsApiHooks.pfJsrtQueueBackgroundParse_Experimental =
         (JsrtQueueBackgroundParse_Experimental)
         GetChakraCoreSymbol(module,"JsQueueBackgroundParse_Experimental");
    m_jsApiHooks.pfJsrtDiscardBackgroundParse_Experimental =
         (JsrtDiscardBackgroundParse_Experimental)
         GetChakraCoreSymbol(module,"JsDiscardBackgroundParse_Experimental");
    m_jsApiHooks.pfJsrtExecuteBackgroundParse_Experimental =
         (JsrtExecuteBackgroundParse_Experimental)
         GetChakraCoreSymbol(module,"JsExecuteBackgroundParse_Experimental");
    m_jsApiHooks.pfJsrtTTDCreateRecordRuntime =
         (JsrtTTDCreateRecordRuntimePtr)GetChakraCoreSymbol(module,"JsTTDCreateRecordRuntime");
    m_jsApiHooks.pfJsrtTTDCreateReplayRuntime =
         (JsrtTTDCreateReplayRuntimePtr)GetChakraCoreSymbol(module,"JsTTDCreateReplayRuntime");
    m_jsApiHooks.pfJsrtTTDCreateContext =
         (JsrtTTDCreateContextPtr)GetChakraCoreSymbol(module,"JsTTDCreateContext");
    m_jsApiHooks.pfJsrtTTDNotifyContextDestroy =
         (JsrtTTDNotifyContextDestroyPtr)GetChakraCoreSymbol(module,"JsTTDNotifyContextDestroy");
    m_jsApiHooks.pfJsrtTTDStart = (JsrtTTDStartPtr)GetChakraCoreSymbol(module,"JsTTDStart");
    m_jsApiHooks.pfJsrtTTDStop = (JsrtTTDStopPtr)GetChakraCoreSymbol(module,"JsTTDStop");
    m_jsApiHooks.pfJsrtTTDNotifyYield =
         (JsrtTTDNotifyYieldPtr)GetChakraCoreSymbol(module,"JsTTDNotifyYield");
    m_jsApiHooks.pfJsrtTTDHostExit = (JsrtTTDHostExitPtr)GetChakraCoreSymbol(module,"JsTTDHostExit")
    ;
    m_jsApiHooks.pfJsrtTTDGetSnapTimeTopLevelEventMove =
         (JsrtTTDGetSnapTimeTopLevelEventMovePtr)
         GetChakraCoreSymbol(module,"JsTTDGetSnapTimeTopLevelEventMove");
    m_jsApiHooks.pfJsrtTTDMoveToTopLevelEvent =
         (JsrtTTDMoveToTopLevelEventPtr)GetChakraCoreSymbol(module,"JsTTDMoveToTopLevelEvent");
    m_jsApiHooks.pfJsrtTTDReplayExecution =
         (JsrtTTDReplayExecutionPtr)GetChakraCoreSymbol(module,"JsTTDReplayExecution");
    m_jsApiHooks.pfJsrtVarSerializer =
         (JsrtVarSerializerPtr)GetChakraCoreSymbol(module,"JsVarSerializer");
    m_jsApiHooks.pfJsrtVarSerializerSetTransferableVars =
         (JsrtVarSerializerSetTransferableVarsPtr)
         GetChakraCoreSymbol(module,"JsVarSerializerSetTransferableVars");
    m_jsApiHooks.pfJsrtVarSerializerWriteValue =
         (JsrtVarSerializerWriteValuePtr)GetChakraCoreSymbol(module,"JsVarSerializerWriteValue");
    m_jsApiHooks.pfJsrtVarSerializerReleaseData =
         (JsrtVarSerializerReleaseDataPtr)GetChakraCoreSymbol(module,"JsVarSerializerReleaseData");
    m_jsApiHooks.pfJsrtVarSerializerFree =
         (JsrtVarSerializerFreePtr)GetChakraCoreSymbol(module,"JsVarSerializerFree");
    m_jsApiHooks.pfJsrtVarDeserializer =
         (JsrtVarDeserializerPtr)GetChakraCoreSymbol(module,"JsVarDeserializer");
    m_jsApiHooks.pfJsrtVarDeserializerSetTransferableVars =
         (JsrtVarDeserializerSetTransferableVarsPtr)
         GetChakraCoreSymbol(module,"JsVarDeserializerSetTransferableVars");
    m_jsApiHooks.pfJsrtVarDeserializerReadValue =
         (JsrtVarDeserializerReadValuePtr)GetChakraCoreSymbol(module,"JsVarDeserializerReadValue");
    m_jsApiHooks.pfJsrtVarDeserializerFree =
         (JsrtVarDeserializerFreePtr)GetChakraCoreSymbol(module,"JsVarDeserializerFree");
    m_jsApiHooks.pfJsrtDetachArrayBuffer =
         (JsrtDetachArrayBufferPtr)GetChakraCoreSymbol(module,"JsDetachArrayBuffer");
    m_jsApiHooks.pfJsrtGetArrayBufferFreeFunction =
         (JsrtGetArrayBufferFreeFunction)GetChakraCoreSymbol(module,"JsGetArrayBufferFreeFunction");
    m_jsApiHooks.pfJsrtExternalizeArrayBuffer =
         (JsrtExternalizeArrayBufferPtr)GetChakraCoreSymbol(module,"JsExternalizeArrayBuffer");
    argInfo_local._7_1_ = true;
  }
  else {
    UnloadChakraDll(module);
    argInfo_local._7_1_ = false;
  }
  return argInfo_local._7_1_;
}

Assistant:

bool ChakraRTInterface::LoadChakraDll(ArgInfo* argInfo, HINSTANCE *outLibrary)
{
    m_argInfo = argInfo;
#ifndef CHAKRA_STATIC_LIBRARY
    HINSTANCE library = nullptr;

    char dllName[_MAX_PATH];
    GetBinaryPathWithFileNameA(dllName, _MAX_PATH, chakraDllName);

    library = LoadChakraCore(dllName);
    *outLibrary = library;
    if (library == nullptr)
    {
        int ret = GetLastError();
        fwprintf(stderr, _u("FATAL ERROR: Unable to load %S GetLastError=0x%x\n"), dllName, ret);
        return false;
    }

    if (m_usageStringPrinted)
    {
        UnloadChakraDll(library);
        return false;
    }

    m_jsApiHooks.pfJsrtCreateRuntime = (JsAPIHooks::JsrtCreateRuntimePtr)GetChakraCoreSymbol(library, "JsCreateRuntime");
    m_jsApiHooks.pfJsrtCreateContext = (JsAPIHooks::JsrtCreateContextPtr)GetChakraCoreSymbol(library, "JsCreateContext");
    m_jsApiHooks.pfJsrtSetObjectBeforeCollectCallback = (JsAPIHooks::JsrtSetObjectBeforeCollectCallbackPtr)GetChakraCoreSymbol(library, "JsSetObjectBeforeCollectCallback");
    m_jsApiHooks.pfJsrtSetRuntimeDomWrapperTracingCallbacks = (JsAPIHooks::JsrtSetRuntimeDomWrapperTracingCallbacksPtr)GetChakraCoreSymbol(library, "JsSetRuntimeDomWrapperTracingCallbacks");
    m_jsApiHooks.pfJsrtSetRuntimeMemoryLimit = (JsAPIHooks::JsrtSetRuntimeMemoryLimitPtr)GetChakraCoreSymbol(library, "JsSetRuntimeMemoryLimit");
    m_jsApiHooks.pfJsrtSetCurrentContext = (JsAPIHooks::JsrtSetCurrentContextPtr)GetChakraCoreSymbol(library, "JsSetCurrentContext");
    m_jsApiHooks.pfJsrtGetCurrentContext = (JsAPIHooks::JsrtGetCurrentContextPtr)GetChakraCoreSymbol(library, "JsGetCurrentContext");
    m_jsApiHooks.pfJsrtDisposeRuntime = (JsAPIHooks::JsrtDisposeRuntimePtr)GetChakraCoreSymbol(library, "JsDisposeRuntime");
    m_jsApiHooks.pfJsrtCreateObject = (JsAPIHooks::JsrtCreateObjectPtr)GetChakraCoreSymbol(library, "JsCreateObject");
    m_jsApiHooks.pfJsrtCreateExternalObject = (JsAPIHooks::JsrtCreateExternalObjectPtr)GetChakraCoreSymbol(library, "JsCreateExternalObject");
    m_jsApiHooks.pfJsrtGetArrayForEachFunction = (JsAPIHooks::JsrtGetArrayForEachFunctionPtr)GetChakraCoreSymbol(library, "JsGetArrayForEachFunction");;
    m_jsApiHooks.pfJsrtGetArrayKeysFunction = (JsAPIHooks::JsrtGetArrayKeysFunctionPtr)GetChakraCoreSymbol(library, "JsGetArrayKeysFunction");;
    m_jsApiHooks.pfJsrtGetArrayValuesFunction = (JsAPIHooks::JsrtGetArrayValuesFunctionPtr)GetChakraCoreSymbol(library, "JsGetArrayValuesFunction");;
    m_jsApiHooks.pfJsrtGetArrayEntriesFunction = (JsAPIHooks::JsrtGetArrayEntriesFunctionPtr)GetChakraCoreSymbol(library, "JsGetArrayEntriesFunction");;
    m_jsApiHooks.pfJsrtGetPropertyIdSymbolIterator = (JsAPIHooks::JsrtGetPropertyIdSymbolIteratorPtr)GetChakraCoreSymbol(library, "JsGetPropertyIdSymbolIterator");;
    m_jsApiHooks.pfJsrtGetErrorPrototype = (JsAPIHooks::JsrtGetErrorPrototypePtr)GetChakraCoreSymbol(library, "JsGetErrorPrototype");;
    m_jsApiHooks.pfJsrtGetIteratorPrototype = (JsAPIHooks::JsrtGetIteratorPrototypePtr)GetChakraCoreSymbol(library, "JsGetIteratorPrototype");;
    m_jsApiHooks.pfJsrtCreateFunction = (JsAPIHooks::JsrtCreateFunctionPtr)GetChakraCoreSymbol(library, "JsCreateFunction");
    m_jsApiHooks.pfJsrtCreateNamedFunction = (JsAPIHooks::JsCreateNamedFunctionPtr)GetChakraCoreSymbol(library, "JsCreateNamedFunction");
    m_jsApiHooks.pfJsrtSetProperty = (JsAPIHooks::JsrtSetPropertyPtr)GetChakraCoreSymbol(library, "JsSetProperty");
    m_jsApiHooks.pfJsrtGetGlobalObject = (JsAPIHooks::JsrtGetGlobalObjectPtr)GetChakraCoreSymbol(library, "JsGetGlobalObject");
    m_jsApiHooks.pfJsrtGetUndefinedValue = (JsAPIHooks::JsrtGetUndefinedValuePtr)GetChakraCoreSymbol(library, "JsGetUndefinedValue");
    m_jsApiHooks.pfJsrtGetNullValue = (JsAPIHooks::JsrtGetUndefinedValuePtr)GetChakraCoreSymbol(library, "JsGetNullValue");
    m_jsApiHooks.pfJsrtGetTrueValue = (JsAPIHooks::JsrtGetUndefinedValuePtr)GetChakraCoreSymbol(library, "JsGetTrueValue");
    m_jsApiHooks.pfJsrtGetFalseValue = (JsAPIHooks::JsrtGetUndefinedValuePtr)GetChakraCoreSymbol(library, "JsGetFalseValue");
    m_jsApiHooks.pfJsrtConvertValueToString = (JsAPIHooks::JsrtConvertValueToStringPtr)GetChakraCoreSymbol(library, "JsConvertValueToString");
    m_jsApiHooks.pfJsrtConvertValueToNumber = (JsAPIHooks::JsrtConvertValueToNumberPtr)GetChakraCoreSymbol(library, "JsConvertValueToNumber");
    m_jsApiHooks.pfJsrtConvertValueToBoolean = (JsAPIHooks::JsrtConvertValueToBooleanPtr)GetChakraCoreSymbol(library, "JsConvertValueToBoolean");
    m_jsApiHooks.pfJsrtBooleanToBool = (JsAPIHooks::JsrtBooleanToBoolPtr)GetChakraCoreSymbol(library, "JsBooleanToBool");
    m_jsApiHooks.pfJsrtGetProperty = (JsAPIHooks::JsrtGetPropertyPtr)GetChakraCoreSymbol(library, "JsGetProperty");
    m_jsApiHooks.pfJsrtHasProperty = (JsAPIHooks::JsrtHasPropertyPtr)GetChakraCoreSymbol(library, "JsHasProperty");
    m_jsApiHooks.pfJsrtCallFunction = (JsAPIHooks::JsrtCallFunctionPtr)GetChakraCoreSymbol(library, "JsCallFunction");
    m_jsApiHooks.pfJsrtNumberToDouble = (JsAPIHooks::JsrtNumberToDoublePtr)GetChakraCoreSymbol(library, "JsNumberToDouble");
    m_jsApiHooks.pfJsrtNumberToInt = (JsAPIHooks::JsrtNumberToIntPtr)GetChakraCoreSymbol(library, "JsNumberToInt");
    m_jsApiHooks.pfJsrtIntToNumber = (JsAPIHooks::JsrtIntToNumberPtr)GetChakraCoreSymbol(library, "JsIntToNumber");
    m_jsApiHooks.pfJsrtDoubleToNumber = (JsAPIHooks::JsrtDoubleToNumberPtr)GetChakraCoreSymbol(library, "JsDoubleToNumber");
    m_jsApiHooks.pfJsrtGetExternalData = (JsAPIHooks::JsrtGetExternalDataPtr)GetChakraCoreSymbol(library, "JsGetExternalData");
    m_jsApiHooks.pfJsrtSetExternalData = (JsAPIHooks::JsrtSetExternalDataPtr)GetChakraCoreSymbol(library, "JsSetExternalData");
    m_jsApiHooks.pfJsrtCloneObject = (JsAPIHooks::JsrtCloneObjectPtr)GetChakraCoreSymbol(library, "JsCloneObject");
    m_jsApiHooks.pfJsrtCreateArray = (JsAPIHooks::JsrtCreateArrayPtr)GetChakraCoreSymbol(library, "JsCreateArray");
    m_jsApiHooks.pfJsrtCreateArrayBuffer = (JsAPIHooks::JsrtCreateArrayBufferPtr)GetChakraCoreSymbol(library, "JsCreateArrayBuffer");
    m_jsApiHooks.pfJsrtCreateSharedArrayBufferWithSharedContent = (JsAPIHooks::JsrtCreateSharedArrayBufferWithSharedContentPtr)GetChakraCoreSymbol(library, "JsCreateSharedArrayBufferWithSharedContent");
    m_jsApiHooks.pfJsrtGetSharedArrayBufferContent = (JsAPIHooks::JsrtGetSharedArrayBufferContentPtr)GetChakraCoreSymbol(library, "JsGetSharedArrayBufferContent");
    m_jsApiHooks.pfJsrtReleaseSharedArrayBufferContentHandle = (JsAPIHooks::JsrtReleaseSharedArrayBufferContentHandlePtr)GetChakraCoreSymbol(library, "JsReleaseSharedArrayBufferContentHandle");
    m_jsApiHooks.pfJsrtGetArrayBufferStorage = (JsAPIHooks::JsrtGetArrayBufferStoragePtr)GetChakraCoreSymbol(library, "JsGetArrayBufferStorage");
    m_jsApiHooks.pfJsrtHasException = (JsAPIHooks::JsrtHasExceptionPtr)GetChakraCoreSymbol(library, "JsHasException");
    m_jsApiHooks.pfJsrtSetException = (JsAPIHooks::JsrtSetExceptionPtr)GetChakraCoreSymbol(library, "JsSetException");
    m_jsApiHooks.pfJsrtGetAndClearExceptionWithMetadata = (JsAPIHooks::JsrtGetAndClearExceptiopnWithMetadataPtr)GetChakraCoreSymbol(library, "JsGetAndClearExceptionWithMetadata");
    m_jsApiHooks.pfJsrtGetAndClearException = (JsAPIHooks::JsrtGetAndClearExceptiopnPtr)GetChakraCoreSymbol(library, "JsGetAndClearException");
    m_jsApiHooks.pfJsrtCreateError = (JsAPIHooks::JsrtCreateErrorPtr)GetChakraCoreSymbol(library, "JsCreateError");
    m_jsApiHooks.pfJsrtGetRuntime = (JsAPIHooks::JsrtGetRuntimePtr)GetChakraCoreSymbol(library, "JsGetRuntime");
    m_jsApiHooks.pfJsrtRelease = (JsAPIHooks::JsrtReleasePtr)GetChakraCoreSymbol(library, "JsRelease");
    m_jsApiHooks.pfJsrtAddRef = (JsAPIHooks::JsrtAddRefPtr)GetChakraCoreSymbol(library, "JsAddRef");
    m_jsApiHooks.pfJsrtGetValueType = (JsAPIHooks::JsrtGetValueType)GetChakraCoreSymbol(library, "JsGetValueType");
    m_jsApiHooks.pfJsrtGetIndexedProperty = (JsAPIHooks::JsrtGetIndexedPropertyPtr)GetChakraCoreSymbol(library, "JsGetIndexedProperty");
    m_jsApiHooks.pfJsrtSetIndexedProperty = (JsAPIHooks::JsrtSetIndexedPropertyPtr)GetChakraCoreSymbol(library, "JsSetIndexedProperty");
    m_jsApiHooks.pfJsrtSetPromiseContinuationCallback = (JsAPIHooks::JsrtSetPromiseContinuationCallbackPtr)GetChakraCoreSymbol(library, "JsSetPromiseContinuationCallback");
    m_jsApiHooks.pfJsrtSetHostPromiseRejectionTracker = (JsAPIHooks::JsrtSetHostPromiseRejectionTrackerPtr)GetChakraCoreSymbol(library, "JsSetHostPromiseRejectionTracker");
    m_jsApiHooks.pfJsrtGetContextOfObject = (JsAPIHooks::JsrtGetContextOfObject)GetChakraCoreSymbol(library, "JsGetContextOfObject");
    m_jsApiHooks.pfJsrtInitializeModuleRecord = (JsAPIHooks::JsInitializeModuleRecordPtr)GetChakraCoreSymbol(library, "JsInitializeModuleRecord");
    m_jsApiHooks.pfJsrtParseModuleSource = (JsAPIHooks::JsParseModuleSourcePtr)GetChakraCoreSymbol(library, "JsParseModuleSource");
    m_jsApiHooks.pfJsrtSetModuleHostInfo = (JsAPIHooks::JsSetModuleHostInfoPtr)GetChakraCoreSymbol(library, "JsSetModuleHostInfo");
    m_jsApiHooks.pfJsrtGetModuleHostInfo = (JsAPIHooks::JsGetModuleHostInfoPtr)GetChakraCoreSymbol(library, "JsGetModuleHostInfo");
    m_jsApiHooks.pfJsrtModuleEvaluation = (JsAPIHooks::JsModuleEvaluationPtr)GetChakraCoreSymbol(library, "JsModuleEvaluation");
    m_jsApiHooks.pfJsrtGetModuleNamespace = (JsAPIHooks::JsGetModuleNamespacePtr)GetChakraCoreSymbol(library, "JsGetModuleNamespace");
    m_jsApiHooks.pfJsrtDiagStartDebugging = (JsAPIHooks::JsrtDiagStartDebugging)GetChakraCoreSymbol(library, "JsDiagStartDebugging");
    m_jsApiHooks.pfJsrtDiagStopDebugging = (JsAPIHooks::JsrtDiagStopDebugging)GetChakraCoreSymbol(library, "JsDiagStopDebugging");
    m_jsApiHooks.pfJsrtDiagGetSource = (JsAPIHooks::JsrtDiagGetSource)GetChakraCoreSymbol(library, "JsDiagGetSource");
    m_jsApiHooks.pfJsrtDiagSetBreakpoint = (JsAPIHooks::JsrtDiagSetBreakpoint)GetChakraCoreSymbol(library, "JsDiagSetBreakpoint");
    m_jsApiHooks.pfJsrtDiagGetStackTrace = (JsAPIHooks::JsrtDiagGetStackTrace)GetChakraCoreSymbol(library, "JsDiagGetStackTrace");
    m_jsApiHooks.pfJsrtDiagRequestAsyncBreak = (JsAPIHooks::JsrtDiagRequestAsyncBreak)GetChakraCoreSymbol(library, "JsDiagRequestAsyncBreak");
    m_jsApiHooks.pfJsrtDiagGetBreakpoints = (JsAPIHooks::JsrtDiagGetBreakpoints)GetChakraCoreSymbol(library, "JsDiagGetBreakpoints");
    m_jsApiHooks.pfJsrtDiagRemoveBreakpoint = (JsAPIHooks::JsrtDiagRemoveBreakpoint)GetChakraCoreSymbol(library, "JsDiagRemoveBreakpoint");
    m_jsApiHooks.pfJsrtDiagSetBreakOnException = (JsAPIHooks::JsrtDiagSetBreakOnException)GetChakraCoreSymbol(library, "JsDiagSetBreakOnException");
    m_jsApiHooks.pfJsrtDiagGetBreakOnException = (JsAPIHooks::JsrtDiagGetBreakOnException)GetChakraCoreSymbol(library, "JsDiagGetBreakOnException");
    m_jsApiHooks.pfJsrtDiagSetStepType = (JsAPIHooks::JsrtDiagSetStepType)GetChakraCoreSymbol(library, "JsDiagSetStepType");
    m_jsApiHooks.pfJsrtDiagGetScripts = (JsAPIHooks::JsrtDiagGetScripts)GetChakraCoreSymbol(library, "JsDiagGetScripts");
    m_jsApiHooks.pfJsrtDiagGetFunctionPosition = (JsAPIHooks::JsrtDiagGetFunctionPosition)GetChakraCoreSymbol(library, "JsDiagGetFunctionPosition");
    m_jsApiHooks.pfJsrtDiagGetStackProperties = (JsAPIHooks::JsrtDiagGetStackProperties)GetChakraCoreSymbol(library, "JsDiagGetStackProperties");
    m_jsApiHooks.pfJsrtDiagGetProperties = (JsAPIHooks::JsrtDiagGetProperties)GetChakraCoreSymbol(library, "JsDiagGetProperties");
    m_jsApiHooks.pfJsrtDiagGetObjectFromHandle = (JsAPIHooks::JsrtDiagGetObjectFromHandle)GetChakraCoreSymbol(library, "JsDiagGetObjectFromHandle");
    m_jsApiHooks.pfJsrtDiagEvaluate = (JsAPIHooks::JsrtDiagEvaluate)GetChakraCoreSymbol(library, "JsDiagEvaluate");
    m_jsApiHooks.pfJsrtRun = (JsAPIHooks::JsrtRun)GetChakraCoreSymbol(library, "JsRun");
    m_jsApiHooks.pfJsrtParse = (JsAPIHooks::JsrtParse)GetChakraCoreSymbol(library, "JsParse");
    m_jsApiHooks.pfJsrtSerialize = (JsAPIHooks::JsrtSerialize)GetChakraCoreSymbol(library, "JsSerialize");
    m_jsApiHooks.pfJsrtRunSerialized = (JsAPIHooks::JsrtRunSerialized)GetChakraCoreSymbol(library, "JsRunSerialized");
    m_jsApiHooks.pfJsrtGetStringLength = (JsAPIHooks::JsrtGetStringLength)GetChakraCoreSymbol(library, "JsGetStringLength");
    m_jsApiHooks.pfJsrtCreateString = (JsAPIHooks::JsrtCreateString)GetChakraCoreSymbol(library, "JsCreateString");
    m_jsApiHooks.pfJsrtCreateStringUtf16 = (JsAPIHooks::JsrtCreateStringUtf16)GetChakraCoreSymbol(library, "JsCreateStringUtf16");
    m_jsApiHooks.pfJsrtCopyString = (JsAPIHooks::JsrtCopyString)GetChakraCoreSymbol(library, "JsCopyString");
    m_jsApiHooks.pfJsrtCreatePropertyId = (JsAPIHooks::JsrtCreatePropertyId)GetChakraCoreSymbol(library, "JsCreatePropertyId");
    m_jsApiHooks.pfJsrtCreateExternalArrayBuffer = (JsAPIHooks::JsrtCreateExternalArrayBuffer)GetChakraCoreSymbol(library, "JsCreateExternalArrayBuffer");
    m_jsApiHooks.pfJsrtGetProxyProperties = (JsAPIHooks::JsrtGetProxyProperties)GetChakraCoreSymbol(library, "JsGetProxyProperties");
    m_jsApiHooks.pfJsrtSerializeParserState = (JsAPIHooks::JsrtSerializeParserState)GetChakraCoreSymbol(library, "JsSerializeParserState");
    m_jsApiHooks.pfJsrtRunScriptWithParserState = (JsAPIHooks::JsrtRunScriptWithParserState)GetChakraCoreSymbol(library, "JsRunScriptWithParserState");

    m_jsApiHooks.pfJsrtQueueBackgroundParse_Experimental = (JsAPIHooks::JsrtQueueBackgroundParse_Experimental)GetChakraCoreSymbol(library, "JsQueueBackgroundParse_Experimental");
    m_jsApiHooks.pfJsrtDiscardBackgroundParse_Experimental = (JsAPIHooks::JsrtDiscardBackgroundParse_Experimental)GetChakraCoreSymbol(library, "JsDiscardBackgroundParse_Experimental");
    m_jsApiHooks.pfJsrtExecuteBackgroundParse_Experimental = (JsAPIHooks::JsrtExecuteBackgroundParse_Experimental)GetChakraCoreSymbol(library, "JsExecuteBackgroundParse_Experimental");

    m_jsApiHooks.pfJsrtTTDCreateRecordRuntime = (JsAPIHooks::JsrtTTDCreateRecordRuntimePtr)GetChakraCoreSymbol(library, "JsTTDCreateRecordRuntime");
    m_jsApiHooks.pfJsrtTTDCreateReplayRuntime = (JsAPIHooks::JsrtTTDCreateReplayRuntimePtr)GetChakraCoreSymbol(library, "JsTTDCreateReplayRuntime");
    m_jsApiHooks.pfJsrtTTDCreateContext = (JsAPIHooks::JsrtTTDCreateContextPtr)GetChakraCoreSymbol(library, "JsTTDCreateContext");
    m_jsApiHooks.pfJsrtTTDNotifyContextDestroy = (JsAPIHooks::JsrtTTDNotifyContextDestroyPtr)GetChakraCoreSymbol(library, "JsTTDNotifyContextDestroy");

    m_jsApiHooks.pfJsrtTTDStart = (JsAPIHooks::JsrtTTDStartPtr)GetChakraCoreSymbol(library, "JsTTDStart");
    m_jsApiHooks.pfJsrtTTDStop = (JsAPIHooks::JsrtTTDStopPtr)GetChakraCoreSymbol(library, "JsTTDStop");

    m_jsApiHooks.pfJsrtTTDNotifyYield = (JsAPIHooks::JsrtTTDNotifyYieldPtr)GetChakraCoreSymbol(library, "JsTTDNotifyYield");
    m_jsApiHooks.pfJsrtTTDHostExit = (JsAPIHooks::JsrtTTDHostExitPtr)GetChakraCoreSymbol(library, "JsTTDHostExit");

    m_jsApiHooks.pfJsrtTTDGetSnapTimeTopLevelEventMove = (JsAPIHooks::JsrtTTDGetSnapTimeTopLevelEventMovePtr)GetChakraCoreSymbol(library, "JsTTDGetSnapTimeTopLevelEventMove");
    m_jsApiHooks.pfJsrtTTDMoveToTopLevelEvent = (JsAPIHooks::JsrtTTDMoveToTopLevelEventPtr)GetChakraCoreSymbol(library, "JsTTDMoveToTopLevelEvent");
    m_jsApiHooks.pfJsrtTTDReplayExecution = (JsAPIHooks::JsrtTTDReplayExecutionPtr)GetChakraCoreSymbol(library, "JsTTDReplayExecution");
    m_jsApiHooks.pfJsrtVarSerializer = (JsAPIHooks::JsrtVarSerializerPtr)GetChakraCoreSymbol(library, "JsVarSerializer");
    m_jsApiHooks.pfJsrtVarSerializerSetTransferableVars = (JsAPIHooks::JsrtVarSerializerSetTransferableVarsPtr)GetChakraCoreSymbol(library, "JsVarSerializerSetTransferableVars");
    m_jsApiHooks.pfJsrtVarSerializerWriteValue = (JsAPIHooks::JsrtVarSerializerWriteValuePtr)GetChakraCoreSymbol(library, "JsVarSerializerWriteValue");
    m_jsApiHooks.pfJsrtVarSerializerReleaseData = (JsAPIHooks::JsrtVarSerializerReleaseDataPtr)GetChakraCoreSymbol(library, "JsVarSerializerReleaseData");
    m_jsApiHooks.pfJsrtVarSerializerFree = (JsAPIHooks::JsrtVarSerializerFreePtr)GetChakraCoreSymbol(library, "JsVarSerializerFree");
    m_jsApiHooks.pfJsrtVarDeserializer = (JsAPIHooks::JsrtVarDeserializerPtr)GetChakraCoreSymbol(library, "JsVarDeserializer");
    m_jsApiHooks.pfJsrtVarDeserializerSetTransferableVars = (JsAPIHooks::JsrtVarDeserializerSetTransferableVarsPtr)GetChakraCoreSymbol(library, "JsVarDeserializerSetTransferableVars");
    m_jsApiHooks.pfJsrtVarDeserializerReadValue = (JsAPIHooks::JsrtVarDeserializerReadValuePtr)GetChakraCoreSymbol(library, "JsVarDeserializerReadValue");
    m_jsApiHooks.pfJsrtVarDeserializerFree = (JsAPIHooks::JsrtVarDeserializerFreePtr)GetChakraCoreSymbol(library, "JsVarDeserializerFree");

    m_jsApiHooks.pfJsrtDetachArrayBuffer = (JsAPIHooks::JsrtDetachArrayBufferPtr)GetChakraCoreSymbol(library, "JsDetachArrayBuffer");
    m_jsApiHooks.pfJsrtGetArrayBufferFreeFunction = (JsAPIHooks::JsrtGetArrayBufferFreeFunction)GetChakraCoreSymbol(library, "JsGetArrayBufferFreeFunction");
    m_jsApiHooks.pfJsrtExternalizeArrayBuffer = (JsAPIHooks::JsrtExternalizeArrayBufferPtr)GetChakraCoreSymbol(library, "JsExternalizeArrayBuffer");

#ifdef _WIN32
    m_jsApiHooks.pfJsrtConnectJITProcess = (JsAPIHooks::JsrtConnectJITProcess)GetChakraCoreSymbol(library, "JsConnectJITProcess");
#endif
#endif

    return true;
}